

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guardedTests.cpp
# Opt level: O1

void __thiscall guarded_guarded_2_Test::TestBody(guarded_guarded_2_Test *this)

{
  pointer *__ptr;
  char *message;
  thread th2;
  AssertionResult gtest_ar;
  thread th1;
  handle data_handle;
  guarded<int,_std::mutex> data;
  Message local_88;
  long local_80;
  AssertHelper local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  long local_60;
  long *local_58;
  unique_lock<std::mutex> local_50;
  int local_40 [2];
  __native_type local_38;
  
  local_40[0] = 0;
  local_38.__align = 0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_38.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_38.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_60 = 0;
  local_58 = (long *)operator_new(0x10);
  *local_58 = (long)&PTR___State_00175660;
  local_58[1] = (long)local_40;
  std::thread::_M_start_thread(&local_60,&local_58,0);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  local_80 = 0;
  local_58 = (long *)operator_new(0x10);
  *local_58 = (long)&PTR___State_001756a0;
  local_58[1] = (long)local_40;
  std::thread::_M_start_thread(&local_80,&local_58,0);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  std::thread::join();
  std::thread::join();
  local_50._M_device = (mutex_type *)&local_38;
  local_50._M_owns = false;
  local_58 = (long *)local_40;
  std::unique_lock<std::mutex>::lock(&local_50);
  local_50._M_owns = true;
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 20000;
  testing::internal::CmpHelperEQ<int,int>
            (local_70,"*data_handle","20000",(int *)local_58,(int *)&local_88);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x6d,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_50);
  if ((local_80 == 0) && (local_60 == 0)) {
    return;
  }
  std::terminate();
}

Assistant:

TEST(guarded, guarded_2)
{
    guarded<int> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    th1.join();
    th2.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 20000);
}